

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.cpp
# Opt level: O3

Value * __thiscall luna::StackAPI::GetValue(StackAPI *this,int index)

{
  State *pSVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  pSVar1 = this->state_;
  if ((pSVar1->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl.
      _M_node.super__List_node_base._M_next == (_List_node_base *)&pSVar1->calls_) {
    __assert_fail("!state_->calls_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/LibAPI.cpp"
                  ,0x67,"Value *luna::StackAPI::GetValue(int)");
  }
  if (index < 0) {
    p_Var2 = (_List_node_base *)this->stack_->top_;
    p_Var3 = p_Var2 + index;
  }
  else {
    p_Var3 = (pSVar1->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>.
             _M_impl._M_node.super__List_node_base._M_prev[1]._M_next + (uint)index;
    p_Var2 = (_List_node_base *)this->stack_->top_;
  }
  if (p_Var3 < p_Var2) {
    p_Var2 = (_List_node_base *)0x0;
    if ((pSVar1->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl.
        _M_node.super__List_node_base._M_prev[1]._M_next <= p_Var3) {
      p_Var2 = p_Var3;
    }
    return (Value *)p_Var2;
  }
  return (Value *)0x0;
}

Assistant:

Value * StackAPI::GetValue(int index)
    {
        assert(!state_->calls_.empty());
        Value *v = nullptr;
        if (index < 0)
            v = stack_->top_ + index;
        else
            v = state_->calls_.back().register_ + index;

        if (v >= stack_->top_ || v < state_->calls_.back().register_)
            return nullptr;
        else
            return v;
    }